

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderRenderTextureFunctionTests.cpp
# Opt level: O3

void vkt::sr::anon_unknown_0::evalTexture2DShadowGrad(ShaderEvalContext *c,TexLookupParams *param_2)

{
  float s;
  float t;
  Texture2D *pTVar1;
  uint uVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar12;
  float fVar13;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  IVec3 local_14;
  
  fVar5 = c->in[0].m_data[2];
  pTVar1 = c->textures[0].tex2D;
  fVar3 = (float)pTVar1->m_width;
  s = c->in[0].m_data[0];
  fVar8 = (float)pTVar1->m_height;
  t = c->in[0].m_data[1];
  fVar4 = fVar3 * c->in[1].m_data[0];
  fVar6 = fVar3 * c->in[2].m_data[0];
  fVar7 = fVar3 * c->in[1].m_data[2];
  fVar3 = fVar3 * c->in[1].m_data[3];
  fVar9 = fVar8 * c->in[1].m_data[1];
  fVar12 = fVar8 * c->in[2].m_data[1];
  fVar13 = fVar8 * c->in[1].m_data[3];
  fVar8 = fVar8 * c->in[2].m_data[0];
  auVar10._0_4_ = fVar9 * fVar9;
  auVar10._4_4_ = fVar12 * fVar12;
  auVar10._8_4_ = fVar13 * fVar13;
  auVar10._12_4_ = fVar8 * fVar8;
  auVar11._0_4_ = fVar4 * fVar4 + auVar10._0_4_;
  auVar11._4_4_ = fVar6 * fVar6 + auVar10._4_4_;
  auVar11._8_4_ = fVar7 * fVar7 + auVar10._8_4_;
  auVar11._12_4_ = fVar3 * fVar3 + auVar10._12_4_;
  auVar11 = sqrtps(auVar10,auVar11);
  uVar2 = -(uint)(auVar11._4_4_ <= auVar11._0_4_);
  fVar3 = logf((float)(~uVar2 & (uint)auVar11._4_4_ | (uint)auVar11._0_4_ & uVar2));
  pTVar1 = c->textures[0].tex2D;
  local_14.m_data[0] = 0;
  local_14.m_data[1] = 0;
  local_14.m_data[2] = 0;
  fVar5 = tcu::sampleLevelArray2DCompare
                    ((pTVar1->m_view).m_levels,(pTVar1->m_view).m_numLevels,&c->textures[0].sampler,
                     fVar5,s,t,fVar3 * 1.442695,&local_14);
  (c->color).m_data[0] = fVar5;
  return;
}

Assistant:

static void		evalTexture2DShadowGrad			(ShaderEvalContext& c, const TexLookupParams&)		{ c.color.x() = texture2DShadow(c, c.in[0].z(), c.in[0].x(), c.in[0].y(), computeLodFromGrad2D(c)); }